

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::makeMove(Board *this,size_t srcRow,size_t srcCol,size_t dstRow,size_t dstCol)

{
  pointer puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = dstRow * this->sizeInt + dstCol;
  uVar4 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  uVar5 = uVar3;
  if ((uVar3 < uVar4) && (uVar5 = this->sizeInt * srcRow + srcCol, uVar5 < uVar4)) {
    uVar2 = puVar1[uVar3];
    puVar1[uVar3] = puVar1[uVar5];
    puVar1[uVar5] = uVar2;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

void Board::makeMove( size_t srcRow, size_t srcCol, size_t dstRow, size_t dstCol )
{
    std::swap( values.at( dstRow * sizeInt + dstCol ), values.at( srcRow * sizeInt + srcCol ));
}